

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::scrollRect(QWidgetPrivate *this,QRect *rect,int dx,int dy)

{
  int iVar1;
  int iVar2;
  QWidget *this_00;
  QWidgetData *pQVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  char cVar6;
  bool bVar7;
  QWidget *parent;
  QWidget *pQVar8;
  long lVar9;
  QWidgetRepaintManager *this_01;
  QRegion *this_02;
  long in_FS_OFFSET;
  QRegion dirtyScrollRegion;
  QRegion childExpose;
  QPoint toplevelOffset;
  QRegion region;
  undefined1 local_88 [8];
  QRegion local_80;
  QRect local_78;
  QPoint local_60;
  undefined1 local_58 [12];
  Representation RStack_4c;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  parent = QWidget::window(this_00);
  pQVar8 = QWidget::window(*(QWidget **)(*(long *)&parent->field_0x8 + 8));
  lVar9 = *(long *)(*(long *)&pQVar8->field_0x8 + 0x78);
  if (lVar9 == 0) {
    lVar9 = 0;
  }
  else {
    lVar9 = *(long *)(lVar9 + 8);
  }
  if (lVar9 == 0) {
    this_01 = (QWidgetRepaintManager *)0x0;
  }
  else {
    this_01 = *(QWidgetRepaintManager **)(lVar9 + 8);
  }
  if (this_01 == (QWidgetRepaintManager *)0x0) goto LAB_0031b5f5;
  if (scrollRect(QRect_const&,int,int)::accelEnv == '\0') {
    scrollRect();
  }
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
  _local_58 = clipRect(this);
  _local_48 = (QRect)QRect::operator&(rect,(QRect *)local_58);
  if ((scrollRect::accelEnv == true) && ((this->field_0x252 & 2) != 0)) {
    bVar5 = QWidget::testAttribute_helper(*(QWidget **)&this->field_0x8,WA_WState_InPaintEvent);
    if (bVar5) goto LAB_0031b312;
    iVar1 = (this->data).crect.x1.m_i;
    iVar2 = (this->data).crect.y1.m_i;
    local_58._4_4_ = local_48._4_4_ + iVar2;
    local_58._0_4_ = local_48._0_4_ + iVar1;
    RStack_4c.m_i = iVar2 + RStack_3c.m_i;
    local_58._8_4_ = iVar1 + local_48._8_4_;
    bVar7 = isOverlapped(this,(QRect *)local_58);
    bVar5 = !bVar7;
  }
  else {
LAB_0031b312:
    bVar7 = false;
    bVar5 = false;
  }
  if (bVar5) {
    local_60 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = stack0xffffffffffffffb0;
    _local_58 = (QRect)(auVar4 << 0x40);
    local_60 = QWidget::mapTo(this_00,parent,(QPoint *)local_58);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
    local_78.x1.m_i = local_48._0_4_ + dx;
    local_78.x2.m_i = local_48._8_4_ + dx;
    local_78.y1.m_i = local_48._4_4_ + dy;
    local_78.y2.m_i = RStack_3c.m_i + dy;
    _local_58 = (QRect)QRect::operator&(&local_78,(QRect *)local_48);
    local_78.x1.m_i = local_58._0_4_.m_i - dx;
    local_78.x2.m_i = local_58._8_4_.m_i - dx;
    local_78.y1.m_i = local_58._4_4_ - dy;
    local_78.y2.m_i = RStack_4c.m_i - dy;
    local_80.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_80,(QRect *)local_48,Rectangle);
    if ((local_78.x1.m_i <= local_78.x2.m_i) && (local_78.y1.m_i <= local_78.y2.m_i)) {
      bVar5 = QWidgetRepaintManager::bltRect(this_01,&local_78,dx,dy,this_00);
      if (bVar5) {
        QRegion::QRegion((QRegion *)local_88,(QRect *)local_58,Rectangle);
        QRegion::operator-=(&local_80,(QRegion *)local_88);
        QRegion::~QRegion((QRegion *)local_88);
      }
    }
    if ((this->field_0x252 & 8) != 0) {
      if (((((rect->x1).m_i == 0) &&
           (pQVar3 = this_00->data,
           (rect->x2).m_i == (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i)) &&
          ((rect->y1).m_i == 0)) &&
         ((rect->y2).m_i == (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i)) {
        QRegion::translate((int)this + 0xe0,dx);
      }
      else {
        local_88 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        QRegion::intersected((QRect *)local_88);
        cVar6 = QRegion::isEmpty();
        if (cVar6 == '\0') {
          QRegion::operator-=(&this->dirty,(QRegion *)local_88);
          QRegion::translate((int)(QRegion *)local_88,dx);
          QRegion::operator+=(&this->dirty,(QRegion *)local_88);
        }
        QRegion::~QRegion((QRegion *)local_88);
      }
    }
    if ((this_00->data->widget_attributes & 0x400) == 0) {
      cVar6 = QRegion::isEmpty();
      if (cVar6 == '\0') {
        QWidgetRepaintManager::markDirty<QRegion>(this_01,&local_80,this_00,UpdateLater,BufferValid)
        ;
        this->field_0x252 = this->field_0x252 | 0x10;
      }
      QRegion::QRegion((QRegion *)local_88,(QRect *)local_58,Rectangle);
      QWidgetRepaintManager::markNeedsFlush(this_01,this_00,(QRegion *)local_88,&local_60);
      QRegion::~QRegion((QRegion *)local_88);
    }
    this_02 = &local_80;
  }
  else {
    if (bVar7 == false) {
      invalidateBackingStore<QRect>(this,(QRect *)local_48);
      goto LAB_0031b5f5;
    }
    this_02 = (QRegion *)local_58;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(this_02,(QRect *)local_48,Rectangle);
    subtractOpaqueSiblings(this,this_02,(bool *)0x0,false);
    invalidateBackingStore<QRegion>(this,this_02);
  }
  QRegion::~QRegion(this_02);
LAB_0031b5f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::scrollRect(const QRect &rect, int dx, int dy)
{
    Q_Q(QWidget);
    QWidget *tlw = q->window();

    QWidgetRepaintManager *repaintManager = QWidgetPrivate::get(tlw)->maybeRepaintManager();
    if (!repaintManager)
        return;

    static const bool accelEnv = qEnvironmentVariableIntValue("QT_NO_FAST_SCROLL") == 0;

    const QRect scrollRect = rect & clipRect();
    bool overlapped = false;
    bool accelerateScroll = accelEnv && isOpaque && !q_func()->testAttribute(Qt::WA_WState_InPaintEvent)
                            && !(overlapped = isOverlapped(scrollRect.translated(data.crect.topLeft())));

    if (!accelerateScroll) {
        if (overlapped) {
            QRegion region(scrollRect);
            subtractOpaqueSiblings(region);
            invalidateBackingStore(region);
        }else {
            invalidateBackingStore(scrollRect);
        }
    } else {
        const QPoint toplevelOffset = q->mapTo(tlw, QPoint());
        const QRect destRect = scrollRect.translated(dx, dy) & scrollRect;
        const QRect sourceRect = destRect.translated(-dx, -dy);

        QRegion childExpose(scrollRect);
        if (sourceRect.isValid()) {
            if (repaintManager->bltRect(sourceRect, dx, dy, q))
                childExpose -= destRect;
        }

        if (inDirtyList) {
            if (rect == q->rect()) {
                dirty.translate(dx, dy);
            } else {
                QRegion dirtyScrollRegion = dirty.intersected(scrollRect);
                if (!dirtyScrollRegion.isEmpty()) {
                    dirty -= dirtyScrollRegion;
                    dirtyScrollRegion.translate(dx, dy);
                    dirty += dirtyScrollRegion;
                }
            }
        }

        if (!q->updatesEnabled())
            return;

        if (!childExpose.isEmpty()) {
            repaintManager->markDirty(childExpose, q);
            isScrolled = true;
        }

        // Instead of using native scroll-on-screen, we copy from
        // backingstore, giving only one screen update for each
        // scroll, and a solid appearance
        repaintManager->markNeedsFlush(q, destRect, toplevelOffset);
    }
}